

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

result<double,_toml::error_info> *
toml::read_hex_float
          (result<double,_toml::error_info> *__return_storage_ptr__,string *str,source_location *src
          ,double val)

{
  int iVar1;
  allocator<char> local_18a;
  allocator<char> local_189;
  value_type_conflict6 local_188;
  string local_180;
  string local_160;
  source_location local_140;
  error_info local_c8;
  error_info local_70;
  
  local_188 = val;
  iVar1 = __isoc99_sscanf((str->_M_dataplus)._M_p,"%la");
  if (iVar1 == 1) {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = local_188;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,
               "toml::parse_floating: failed to read hexadecimal floating point value ",&local_189);
    source_location::source_location(&local_140,src);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"here",&local_18a);
    make_error_info<>(&local_c8,&local_160,&local_140,&local_180);
    err<toml::error_info>((failure<toml::error_info> *)&local_70,&local_c8);
    result<double,_toml::error_info>::result(__return_storage_ptr__,(failure_type *)&local_70);
    error_info::~error_info(&local_70);
    error_info::~error_info(&local_c8);
    std::__cxx11::string::~string((string *)&local_180);
    source_location::~source_location(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<double, error_info>
read_hex_float(const std::string& str, const source_location src, double val)
{
#if defined(_MSC_VER) && ! defined(__clang__)
    const auto res = ::sscanf_s(str.c_str(), "%la", std::addressof(val));
#else
    const auto res = std::sscanf(str.c_str(), "%la", std::addressof(val));
#endif
    if(res != 1)
    {
        return err(make_error_info("toml::parse_floating: "
            "failed to read hexadecimal floating point value ",
            std::move(src), "here"));
    }
    return ok(val);
}